

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# skin.cpp
# Opt level: O2

Stream * rw::readSkinSplitData(Stream *stream,Skin *skin)

{
  int32 iVar1;
  int8 *piVar2;
  ulong uVar3;
  
  iVar1 = Stream::readI32(stream);
  skin->boneLimit = iVar1;
  iVar1 = Stream::readI32(stream);
  skin->numMeshes = iVar1;
  iVar1 = Stream::readI32(stream);
  skin->rleSize = iVar1;
  if (skin->numMeshes != 0) {
    uVar3 = (ulong)(uint)((skin->numMeshes + iVar1) * 2 + skin->numBones);
    allocLocation =
         "file: /workspace/llm4binary/github/license_c_cmakelists/aap[P]librw/src/skin.cpp line: 86"
    ;
    piVar2 = (int8 *)(*Engine::memfuncs)(uVar3,0x30116);
    (*stream->_vptr_Stream[4])(stream,piVar2,uVar3);
    skin->remapIndices = piVar2;
    skin->rleCount = (RLEcount *)(piVar2 + skin->numBones);
    skin->rle = (RLE *)((RLEcount *)(piVar2 + skin->numBones) + (long)skin->numMeshes * 2);
  }
  return stream;
}

Assistant:

Stream*
readSkinSplitData(Stream *stream, Skin *skin)
{
	uint32 sz;
	int8 *data;

	skin->boneLimit = stream->readI32();
	skin->numMeshes = stream->readI32();
	skin->rleSize = stream->readI32();
	if(skin->numMeshes){
		sz = skin->numBones + 2*(skin->numMeshes+skin->rleSize);
		data = (int8*)rwMalloc(sz, MEMDUR_EVENT | ID_SKIN);
		stream->read8(data, sz);
		skin->remapIndices = data;
		skin->rleCount = (Skin::RLEcount*)(data + skin->numBones);
		skin->rle = (Skin::RLE*)(data + skin->numBones + 2*skin->numMeshes);
	}
	return stream;
}